

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Clause.cpp
# Opt level: O2

void __thiscall Kernel::Clause::destroyExceptInferenceObject(Clause *this)

{
  DHMap<Kernel::Literal_*,_unsigned_long,_Lib::DefaultHash,_Lib::DefaultHash2> *this_00;
  
  this_00 = &this->_literalPositions->_data;
  if (this_00 != (DHMap<Kernel::Literal_*,_unsigned_long,_Lib::DefaultHash,_Lib::DefaultHash2> *)0x0
     ) {
    Lib::DHMap<Kernel::Literal_*,_unsigned_long,_Lib::DefaultHash,_Lib::DefaultHash2>::~DHMap
              (this_00);
    Lib::InverseLookup<Kernel::Literal>::operator_delete(this_00,0x28);
  }
  Shell::PartialRedundancyHandler::destroyClauseData(this);
  Lib::free(this);
  return;
}

Assistant:

void Clause::destroyExceptInferenceObject()
{
  if (_literalPositions) {
    delete _literalPositions;
  }

  PartialRedundancyHandler::destroyClauseData(this);

  RSTAT_CTR_INC("clauses deleted");

  //We have to get sizeof(Clause) + (_length-1)*sizeof(Literal*)
  //this way, because _length-1 wouldn't behave well for
  //_length==0 on x64 platform.
  size_t size = sizeof(Clause) + _length * sizeof(Literal*);
  size -= sizeof(Literal*);

  DEALLOC_KNOWN(this, size,"Clause");
}